

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O1

RsProdSyntax * __thiscall slang::parsing::Parser::parseRsProd(Parser *this)

{
  bool bVar1;
  TokenKind TVar2;
  ExpressionSyntax *pEVar3;
  RsProdItemSyntax *pRVar4;
  RsRepeatSyntax *pRVar5;
  RsCodeBlockSyntax *pRVar6;
  RsCaseSyntax *pRVar7;
  RsProdItemSyntax *item;
  RsElseClauseSyntax *elseClause;
  RsIfElseSyntax *pRVar8;
  Token TVar9;
  Token TVar10;
  Token TVar11;
  Token keyword;
  
  TVar9 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = TVar9.kind;
  if (TVar2 < CaseKeyword) {
    if (TVar2 == Identifier) {
      pRVar4 = parseRsProdItem(this);
      return &pRVar4->super_RsProdSyntax;
    }
    if (TVar2 == OpenBrace) {
      pRVar6 = parseRsCodeBlock(this);
      return &pRVar6->super_RsProdSyntax;
    }
  }
  else {
    if (TVar2 == CaseKeyword) {
      pRVar7 = parseRsCase(this);
      return &pRVar7->super_RsProdSyntax;
    }
    if (TVar2 == IfKeyword) {
      TVar9 = ParserBase::consume(&this->super_ParserBase);
      TVar10 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
      pEVar3 = parseExpression(this);
      TVar11 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      pRVar4 = parseRsProdItem(this);
      bVar1 = ParserBase::peek(&this->super_ParserBase,ElseKeyword);
      if (bVar1) {
        keyword = ParserBase::consume(&this->super_ParserBase);
        item = parseRsProdItem(this);
        elseClause = slang::syntax::SyntaxFactory::rsElseClause(&this->factory,keyword,item);
      }
      else {
        elseClause = (RsElseClauseSyntax *)0x0;
      }
      pRVar8 = slang::syntax::SyntaxFactory::rsIfElse
                         (&this->factory,TVar9,TVar10,pEVar3,TVar11,pRVar4,elseClause);
      return &pRVar8->super_RsProdSyntax;
    }
    if (TVar2 == RepeatKeyword) {
      TVar9 = ParserBase::consume(&this->super_ParserBase);
      TVar10 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
      pEVar3 = parseExpression(this);
      TVar11 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      pRVar4 = parseRsProdItem(this);
      pRVar5 = slang::syntax::SyntaxFactory::rsRepeat
                         (&this->factory,TVar9,TVar10,pEVar3,TVar11,pRVar4);
      return &pRVar5->super_RsProdSyntax;
    }
  }
  return (RsProdSyntax *)0x0;
}

Assistant:

RsProdSyntax* Parser::parseRsProd() {
    switch (peek().kind) {
        case TokenKind::Identifier:
            return &parseRsProdItem();
        case TokenKind::IfKeyword: {
            auto keyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& condition = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            auto& ifItem = parseRsProdItem();

            RsElseClauseSyntax* elseClause = nullptr;
            if (peek(TokenKind::ElseKeyword)) {
                auto elseKeyword = consume();
                auto& elseItem = parseRsProdItem();
                elseClause = &factory.rsElseClause(elseKeyword, elseItem);
            }

            return &factory.rsIfElse(keyword, openParen, condition, closeParen, ifItem, elseClause);
        }
        case TokenKind::RepeatKeyword: {
            auto keyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& expr = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            auto& item = parseRsProdItem();

            return &factory.rsRepeat(keyword, openParen, expr, closeParen, item);
        }
        case TokenKind::CaseKeyword:
            return &parseRsCase();
        case TokenKind::OpenBrace:
            return &parseRsCodeBlock();
        default:
            return nullptr;
    }
}